

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O1

int grapg_5_3::dijkstra_1(m_graph g,int v)

{
  int (*__src) [10];
  int iVar1;
  void *pvVar2;
  int iVar3;
  void *pvVar4;
  undefined4 *__dest;
  int iVar5;
  void *pvVar6;
  undefined4 *__s;
  undefined8 uStack_40;
  long local_38;
  
  iVar1 = g.vnum;
  pvVar6 = (void *)(ulong)(uint)g.vnum;
  pvVar2 = (void *)((long)pvVar6 * 4 + 0xfU & 0xfffffffffffffff0);
  __dest = (undefined4 *)((long)&local_38 - (long)pvVar2);
  __s = (undefined4 *)((long)__dest - (long)pvVar2);
  if (0 < g.vnum) {
    local_38 = (long)v;
    *(undefined8 *)(__s + -2) = 0x103173;
    memset(__s,0,(long)pvVar6 * 4);
    __src = g.arc + local_38;
    *(undefined8 *)(__s + -2) = 0x10318a;
    pvVar2 = memcpy(__dest,__src,(long)pvVar6 * 4);
  }
  *__s = 1;
  *__dest = 0;
  do {
    do {
      iVar3 = -1;
      if (0 < iVar1) {
        pvVar4 = (void *)0x0;
        do {
          if (__s[(long)pvVar4] == 0) {
            iVar5 = __dest[(long)pvVar4];
            if (iVar5 < iVar3) {
              pvVar2 = pvVar4;
            }
            pvVar2 = (void *)((ulong)pvVar2 & 0xffffffff);
            if (iVar5 < iVar3) {
              iVar3 = iVar5;
            }
          }
          pvVar4 = (void *)((long)pvVar4 + 1);
        } while (pvVar6 != pvVar4);
      }
      __s[(int)pvVar2] = 1;
    } while (iVar1 < 1);
    pvVar4 = (void *)0x0;
    do {
      if (__s[(long)pvVar4] == 0) {
        iVar5 = g.arc[(int)pvVar2][(long)pvVar4] + iVar3;
        if ((int)__dest[(long)pvVar4] <= iVar5) {
          iVar5 = __dest[(long)pvVar4];
        }
        __dest[(long)pvVar4] = iVar5;
      }
      pvVar4 = (void *)((long)pvVar4 + 1);
    } while (pvVar6 != pvVar4);
  } while( true );
}

Assistant:

int dijkstra_1(m_graph g, int v) {
        int min, k;
        int ver[g.vnum];
        int dis[g.vnum];
        int flag[g.vnum];
        for (int i = 0; i < g.vnum; i++) {
            dis[i] = g.arc[v][i];
            flag[i] = 0;
            ver[i] = 0;
        }
        flag[0] = 1;//自己一个点不用求
        dis[0] = 0;//自己到自己距离0
        for (int i = 1; i < g.vnum; i++) {
            min = INTMAX_MAX;
            for (int j = 0; j < g.vnum; j++) {
                if (flag[j] == 0 && dis[j] < min) {
                    min = dis[j];
                    k = j;
                }
            }
            flag[k] = 1;
            for (int j = 0; j < g.vnum; j++) {
                if (flag[j] == 0 && min + g.arc[k][j] < dis[j]) {
                    dis[j] = min + g.arc[k][j];
                    ver[j] = k;
                }
            }
        }
    }